

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall Chainstate::UpdateTip(Chainstate *this,CBlockIndex *pindexNew)

{
  undefined1 uVar1;
  CCoinsViewCache *container;
  CChainParams *params_00;
  Chainstate *pCVar2;
  Params *args;
  char *in_RSI;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  ThresholdState state;
  CBlockIndex *pindex;
  int BACKGROUND_LOG_INTERVAL;
  CChainParams *params;
  CCoinsViewCache *coins_tip;
  int bit;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warning_messages;
  WarningBitsConditionChecker checker;
  bilingual_str warning;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  ChainstateManager *in_stack_fffffffffffffd10;
  ChainstateManager *in_stack_fffffffffffffd18;
  bilingual_str *separator;
  size_type in_stack_fffffffffffffd20;
  Chainstate *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  ThresholdState in_stack_fffffffffffffd4c;
  reference in_stack_fffffffffffffd50;
  ConstevalStringLiteral in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  ThresholdState TVar3;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  allocator<char> local_207;
  allocator<char> local_206;
  allocator<char> local_205;
  int local_204;
  CBlockIndex *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  CChainParams *in_stack_fffffffffffffe20;
  CBlockIndex *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined1 local_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd0c,(AnnotatedMixin<std::recursive_mutex> *)0x7d564b);
  container = CoinsTip(in_stack_fffffffffffffd28);
  params_00 = ChainstateManager::GetParams
                        ((ChainstateManager *)
                         CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  pCVar2 = ChainstateManager::ActiveChainstate(in_stack_fffffffffffffd18);
  if (in_RDI == pCVar2) {
    if (in_RDI->m_mempool != (CTxMemPool *)0x0) {
      CTxMemPool::AddTransactionsUpdated
                ((CTxMemPool *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),0);
    }
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    uVar1 = ChainstateManager::IsInitialBlockDownload
                      ((ChainstateManager *)
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    if (!(bool)uVar1) {
      for (local_204 = 0; local_204 < 0x1d; local_204 = local_204 + 1) {
        WarningBitsConditionChecker::WarningBitsConditionChecker
                  ((WarningBitsConditionChecker *)in_stack_fffffffffffffd18,
                   in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
        in_stack_fffffffffffffd58.lit = in_RSI;
        args = CChainParams::GetConsensus
                         ((CChainParams *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        in_stack_fffffffffffffd50 =
             std::
             array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
             ::at((array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
                   *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        in_stack_fffffffffffffd4c =
             AbstractThresholdConditionChecker::GetStateFor
                       ((AbstractThresholdConditionChecker *)container,in_stack_fffffffffffffe08,
                        &params_00->consensus,
                        (ThresholdConditionCache *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        if ((in_stack_fffffffffffffd4c == ACTIVE) || (in_stack_fffffffffffffd4c == LOCKED_IN)) {
          TVar3 = in_stack_fffffffffffffd4c;
          ::_(in_stack_fffffffffffffd58);
          tinyformat::format<int>
                    ((bilingual_str *)CONCAT17(uVar1,in_stack_fffffffffffffd68),(int *)args);
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
          ;
          if (TVar3 == ACTIVE) {
            in_stack_fffffffffffffd40 =
                 (string *)
                 ChainstateManager::GetNotifications
                           ((ChainstateManager *)
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            (**(_func_int **)((long)(in_stack_fffffffffffffd40->_M_dataplus)._M_p + 0x28))
                      (in_stack_fffffffffffffd40,0,local_a8);
          }
          else {
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                      ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                       in_stack_fffffffffffffd18,(value_type *)in_stack_fffffffffffffd10);
          }
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
          ;
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    separator = (bilingual_str *)&local_206;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    Untranslated(in_stack_fffffffffffffd40);
    util::Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str>
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)container,separator);
    UpdateTipLog((CCoinsViewCache *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                 in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (string *)in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator(&local_207);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator(&local_206);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator(&local_205);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)separator);
  }
  else if (*(int *)(in_RSI + 0x18) % 2000 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    UpdateTipLog((CCoinsViewCache *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                 in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (string *)in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1d);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1e);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Chainstate::UpdateTip(const CBlockIndex* pindexNew)
{
    AssertLockHeld(::cs_main);
    const auto& coins_tip = this->CoinsTip();

    const CChainParams& params{m_chainman.GetParams()};

    // The remainder of the function isn't relevant if we are not acting on
    // the active chainstate, so return if need be.
    if (this != &m_chainman.ActiveChainstate()) {
        // Only log every so often so that we don't bury log messages at the tip.
        constexpr int BACKGROUND_LOG_INTERVAL = 2000;
        if (pindexNew->nHeight % BACKGROUND_LOG_INTERVAL == 0) {
            UpdateTipLog(coins_tip, pindexNew, params, __func__, "[background validation] ", "");
        }
        return;
    }

    // New best block
    if (m_mempool) {
        m_mempool->AddTransactionsUpdated(1);
    }

    std::vector<bilingual_str> warning_messages;
    if (!m_chainman.IsInitialBlockDownload()) {
        const CBlockIndex* pindex = pindexNew;
        for (int bit = 0; bit < VERSIONBITS_NUM_BITS; bit++) {
            WarningBitsConditionChecker checker(m_chainman, bit);
            ThresholdState state = checker.GetStateFor(pindex, params.GetConsensus(), m_chainman.m_warningcache.at(bit));
            if (state == ThresholdState::ACTIVE || state == ThresholdState::LOCKED_IN) {
                const bilingual_str warning = strprintf(_("Unknown new rules activated (versionbit %i)"), bit);
                if (state == ThresholdState::ACTIVE) {
                    m_chainman.GetNotifications().warningSet(kernel::Warning::UNKNOWN_NEW_RULES_ACTIVATED, warning);
                } else {
                    warning_messages.push_back(warning);
                }
            }
        }
    }
    UpdateTipLog(coins_tip, pindexNew, params, __func__, "",
                 util::Join(warning_messages, Untranslated(", ")).original);
}